

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::DeepScanLineInputFile::readPixelSampleCounts
          (DeepScanLineInputFile *this,int scanline1,int scanline2)

{
  element_type *peVar1;
  ArgExc *this_00;
  undefined1 in_stack_0000069f;
  int in_stack_000006a0;
  int in_stack_000006a4;
  DeepFrameBuffer *in_stack_000006a8;
  Data *in_stack_000006b0;
  
  peVar1 = std::
           __shared_ptr_access<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1a67b4);
  if ((peVar1->frameBufferValid & 1U) == 0) {
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this_00,"readPixelSampleCounts called with no valid frame buffer");
    __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  std::
  __shared_ptr_access<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1a681d);
  std::
  __shared_ptr_access<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1a682f);
  Data::readData(in_stack_000006b0,in_stack_000006a8,in_stack_000006a4,in_stack_000006a0,
                 (bool)in_stack_0000069f);
  return;
}

Assistant:

void
DeepScanLineInputFile::readPixelSampleCounts (int scanline1, int scanline2)
{
    if (!_data->frameBufferValid)
    {
        throw IEX_NAMESPACE::ArgExc (
            "readPixelSampleCounts called with no valid frame buffer");
    }

    _data->readData (_data->frameBuffer, scanline1, scanline2, true);
}